

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::Reader::parse(Reader *this,char *beginDoc,char *endDoc,Value *root)

{
  bool bVar1;
  allocator local_79;
  string local_78;
  undefined1 local_58 [8];
  Token token;
  Value *pVStack_38;
  bool successful;
  Value *local_30;
  Value *root_local;
  char *endDoc_local;
  char *beginDoc_local;
  Reader *this_local;
  
  this->begin_ = beginDoc;
  this->end_ = endDoc;
  this->current_ = this->begin_;
  this->lastValueEnd_ = (Location)0x0;
  this->lastValue_ = (Value *)0x0;
  local_30 = root;
  root_local = (Value *)endDoc;
  endDoc_local = beginDoc;
  beginDoc_local = (char *)this;
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::clear
            (&this->errors_);
  while (bVar1 = std::
                 stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::
                 empty(&this->nodes_), ((bVar1 ^ 0xffU) & 1) != 0) {
    std::stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::pop
              (&this->nodes_);
  }
  pVStack_38 = local_30;
  std::stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::push
            (&this->nodes_,&stack0xffffffffffffffc8);
  token.end_._7_1_ = readValue(this);
  skipCommentTokens(this,(Token *)local_58);
  bVar1 = Value::isArray(local_30);
  if ((!bVar1) && (bVar1 = Value::isObject(local_30), !bVar1)) {
    local_58._0_4_ = tokenError;
    token._0_8_ = endDoc_local;
    token.start_ = (Location)root_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_78,
               "A valid JSON document must be either an array or an object value.",&local_79);
    addError(this,&local_78,(Token *)local_58,(Location)0x0);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    return false;
  }
  return (bool)(token.end_._7_1_ & 1);
}

Assistant:

bool
Reader::parse ( const char* beginDoc, const char* endDoc,
                Value& root)
{
    begin_ = beginDoc;
    end_ = endDoc;
    current_ = begin_;
    lastValueEnd_ = 0;
    lastValue_ = 0;
    errors_.clear ();

    while ( !nodes_.empty () )
        nodes_.pop ();

    nodes_.push ( &root );

    bool successful = readValue ();
    Token token;
    skipCommentTokens ( token );

    if ( !root.isArray ()  &&  !root.isObject () )
    {
        // Set error location to start of doc, ideally should be first token found in doc
        token.type_ = tokenError;
        token.start_ = beginDoc;
        token.end_ = endDoc;
        addError ( "A valid JSON document must be either an array or an object value.",
                   token );
        return false;
    }

    return successful;
}